

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O0

void Ivy_ManCollectCut_rec(Ivy_Man_t *p,Ivy_Obj_t *pNode,Vec_Int_t *vNodes)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Vec_Int_t *vNodes_local;
  Ivy_Obj_t *pNode_local;
  Ivy_Man_t *p_local;
  
  if ((*(uint *)&pNode->field_0x8 >> 4 & 1) == 0) {
    *(uint *)&pNode->field_0x8 = *(uint *)&pNode->field_0x8 & 0xffffffef | 0x10;
    iVar1 = Ivy_ObjIsAnd(pNode);
    if ((iVar1 == 0) && (iVar1 = Ivy_ObjIsExor(pNode), iVar1 == 0)) {
      __assert_fail("Ivy_ObjIsAnd(pNode) || Ivy_ObjIsExor(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyUtil.c"
                    ,0x58,"void Ivy_ManCollectCut_rec(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *)");
    }
    pIVar2 = Ivy_ObjFanin0(pNode);
    Ivy_ManCollectCut_rec(p,pIVar2,vNodes);
    pIVar2 = Ivy_ObjFanin1(pNode);
    Ivy_ManCollectCut_rec(p,pIVar2,vNodes);
    Vec_IntPush(vNodes,pNode->Id);
  }
  return;
}

Assistant:

void Ivy_ManCollectCut_rec( Ivy_Man_t * p, Ivy_Obj_t * pNode, Vec_Int_t * vNodes )
{
    if ( pNode->fMarkA )
        return;
    pNode->fMarkA = 1;
    assert( Ivy_ObjIsAnd(pNode) || Ivy_ObjIsExor(pNode) );
    Ivy_ManCollectCut_rec( p, Ivy_ObjFanin0(pNode), vNodes );
    Ivy_ManCollectCut_rec( p, Ivy_ObjFanin1(pNode), vNodes );
    Vec_IntPush( vNodes, pNode->Id );
}